

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

String * __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::BuildParameterName_abi_cxx11_
          (String *__return_storage_ptr__,ConversionStream *this,
          vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
          *MemberStack,Char Separator,Char *Prefix,Char *SubstituteInstName,Char *Index)

{
  pointer ppSVar1;
  allocator local_29;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,Prefix,&local_29);
  ppSVar1 = (MemberStack->
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  while (ppSVar1 = ppSVar1 + 1,
        ppSVar1 !=
        (MemberStack->
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

String HLSL2GLSLConverterImpl::ConversionStream::BuildParameterName(
    const std::vector<const ShaderParameterInfo*>& MemberStack,
    Char                                           Separator,
    const Char*                                    Prefix,
    const Char*                                    SubstituteInstName,
    const Char*                                    Index) const
{
    String FullName(Prefix);
    auto   it = MemberStack.begin();
    FullName.append(*SubstituteInstName != 0 ? SubstituteInstName : (*it)->Name.c_str());
    FullName.append(Index);
    ++it;
    for (; it != MemberStack.end(); ++it)
    {
        FullName.push_back(Separator);
        FullName.append((*it)->Name);
    }
    return FullName;
}